

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

void run_3::test(void)

{
  sort_5_3::test();
  return;
}

Assistant:

void test() {
        sort_5_3::test();
//        search_5_3::test();
//        grapg_5_3::test();
//        tree_5_3::test();
//        queue_5_3::test();
//        stack_5_3::test();
//        linklist_5_3::test();
//        sqlist_5_3::test();
    }